

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

settings_pack *
libtorrent::load_pack_from_dict(settings_pack *__return_storage_ptr__,bdecode_node *settings)

{
  char *pcVar1;
  bdecode_node *this;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  bool bVar3;
  int iVar4;
  type_t tVar5;
  size_t sVar6;
  int64_t iVar7;
  int i;
  long lVar8;
  undefined8 *puVar9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  allocator<char> local_c1;
  settings_pack *local_c0;
  bdecode_node *local_b8;
  string_view local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_a0;
  string local_50;
  
  (__return_storage_ptr__->super_settings_interface)._vptr_settings_interface =
       (_func_int **)&PTR_set_str_004ce1b0;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  i = 0;
  local_c0 = __return_storage_ptr__;
  local_b8 = settings;
  do {
    this = local_b8;
    iVar4 = bdecode_node::dict_size(local_b8);
    if (iVar4 <= i) {
      return local_c0;
    }
    bdecode_node::dict_at(&local_a0,this,i);
    tVar5 = bdecode_node::type(&local_a0.second);
    if (tVar5 == string_t) {
      puVar9 = &(anonymous_namespace)::str_settings;
      for (lVar8 = 0; bVar2 = local_a0.first, lVar8 != 0xd; lVar8 = lVar8 + 1) {
        pcVar1 = (char *)*puVar9;
        sVar6 = strlen(pcVar1);
        __y_00._M_str = pcVar1;
        __y_00._M_len = sVar6;
        bVar3 = ::std::operator!=(bVar2,__y_00);
        if (!bVar3) {
          local_b0 = bdecode_node::string_value(&local_a0.second);
          ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&local_50,&local_b0,&local_c1);
          settings_pack::set_str(local_c0,(int)lVar8,&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          break;
        }
        puVar9 = puVar9 + 7;
      }
    }
    else if (tVar5 == int_t) {
      iVar4 = 0x4000;
      for (lVar8 = 0; bVar2 = local_a0.first, lVar8 != 0x13e0; lVar8 = lVar8 + 0x20) {
        pcVar1 = *(char **)((long)&(anonymous_namespace)::int_settings + lVar8);
        sVar6 = strlen(pcVar1);
        __y._M_str = pcVar1;
        __y._M_len = sVar6;
        bVar3 = ::std::operator!=(bVar2,__y);
        if (!bVar3) {
          iVar7 = bdecode_node::int_value(&local_a0.second);
          settings_pack::set_int(local_c0,iVar4,(int)iVar7);
          goto LAB_002be652;
        }
        iVar4 = iVar4 + 1;
      }
      iVar4 = 0x8000;
      for (lVar8 = 0; bVar2 = local_a0.first, lVar8 != 0xa80; lVar8 = lVar8 + 0x20) {
        pcVar1 = *(char **)((long)&(anonymous_namespace)::bool_settings + lVar8);
        sVar6 = strlen(pcVar1);
        __y_01._M_str = pcVar1;
        __y_01._M_len = sVar6;
        bVar3 = ::std::operator!=(bVar2,__y_01);
        if (!bVar3) {
          iVar7 = bdecode_node::int_value(&local_a0.second);
          settings_pack::set_bool(local_c0,iVar4,iVar7 != 0);
          break;
        }
        iVar4 = iVar4 + 1;
      }
    }
LAB_002be652:
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&local_a0.second);
    i = i + 1;
  } while( true );
}

Assistant:

settings_pack load_pack_from_dict(bdecode_node const& settings)
	{
		settings_pack pack;

		for (int i = 0; i < settings.dict_size(); ++i)
		{
			auto const [key, val] = settings.dict_at(i);
			switch (val.type())
			{
				case bdecode_node::dict_t:
				case bdecode_node::list_t:
					continue;
				case bdecode_node::int_t:
				{
					bool found = false;
					for (int k = 0; k < int_settings.end_index(); ++k)
					{
						if (key != int_settings[k].name) continue;
						pack.set_int(settings_pack::int_type_base | k, int(val.int_value()));
						found = true;
						break;
					}
					if (found) continue;
					for (int k = 0; k < bool_settings.end_index(); ++k)
					{
						if (key != bool_settings[k].name) continue;
						pack.set_bool(settings_pack::bool_type_base | k, val.int_value() != 0);
						break;
					}
				}
				break;
			case bdecode_node::string_t:
				for (int k = 0; k < str_settings.end_index(); ++k)
				{
					if (key != str_settings[k].name) continue;
					pack.set_str(settings_pack::string_type_base + k, std::string(val.string_value()));
					break;
				}
				break;
			case bdecode_node::none_t:
				break;
			}
		}
		return pack;
	}